

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O1

void __thiscall
VPLGrammar::Parser::FunctionDeclarationNode::BuildProgram
          (FunctionDeclarationNode *this,Scope *scope,ostream *out)

{
  __uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> _Var1;
  long lVar2;
  
  lVar2 = __dynamic_cast((_Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                          )(this->super_ASTNodeBasic).children_.
                           super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                           super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                           ._M_t,&ASTNodeBasic::typeinfo,&ASTTokenBasic::typeinfo,0);
  std::vector<vpl::Function,std::allocator<vpl::Function>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<vpl::Function,std::allocator<vpl::Function>> *)&scope->functions_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 0x38));
  _Var1._M_t.
  super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
  .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
       (this->super_ASTNodeBasic).children_.
       super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
       super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
       ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
              0x28))(_Var1._M_t.
                     super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                     .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,scope,
                     out);
  vpl::Scope::EndFunctionDeclaration(scope);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                scope->DeclareFunction(GET_TOKEN_STRING(children_[1]));
                children_[2]->BuildProgram(scope, out);
                scope->EndFunctionDeclaration();
            }